

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O3

value_type __thiscall
FadExpr<FadFuncExp<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>::dx
          (FadExpr<FadFuncExp<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_> *this,int i)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  Fad<double> *pFVar5;
  Fad<double> *pFVar6;
  double *pdVar7;
  double *pdVar8;
  double dVar9;
  
  pFVar5 = (this->fadexpr_).expr_.fadexpr_.left_;
  pdVar7 = &pFVar5->defaultVal;
  if ((pFVar5->dx_).num_elts != 0) {
    pdVar7 = (pFVar5->dx_).ptr_to_data + i;
  }
  pFVar6 = (this->fadexpr_).expr_.fadexpr_.right_;
  pdVar8 = &pFVar6->defaultVal;
  if ((pFVar6->dx_).num_elts != 0) {
    pdVar8 = (pFVar6->dx_).ptr_to_data + i;
  }
  dVar1 = pFVar6->val_;
  dVar2 = pFVar5->val_;
  dVar3 = *pdVar8;
  dVar4 = *pdVar7;
  dVar9 = exp(dVar1 * dVar2);
  return dVar9 * (dVar4 * dVar1 + dVar3 * dVar2);
}

Assistant:

value_type dx(int i) const { return fadexpr_.dx(i);}